

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_init(ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                         ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_decoder *pDecoder_00;
  ma_decoder_config config_1;
  ma_decoder_config config;
  undefined1 auStack_148 [144];
  
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(auStack_148,0,0x90);
  }
  else {
    memcpy(auStack_148,pConfig,0x90);
  }
  pDecoder_00 = (ma_decoder *)&stack0xffffffffffffff48;
  memcpy(pDecoder_00,auStack_148,0x90);
  mVar1 = ma_decoder__preinit(onRead,onSeek,(ma_decoder_tell_proc)0x0,pUserData,
                              (ma_decoder_config *)pDecoder_00,pDecoder);
  if (mVar1 == MA_SUCCESS) {
    mVar1 = ma_decoder_init__internal
                      ((ma_decoder_read_proc)onSeek,(ma_decoder_seek_proc)&stack0xffffffffffffff48,
                       pDecoder,(ma_decoder_config *)pUserData,pDecoder_00);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_decoder_config config;
    ma_result result;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(onRead, onSeek, NULL, pUserData, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder_init__internal(onRead, onSeek, pUserData, &config, pDecoder);
}